

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::PReLU_x86_avx::forward_inplace(PReLU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  void *pvVar7;
  float *pfVar8;
  size_t sVar9;
  size_t sVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  undefined1 (*pauVar23) [32];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [28];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  
  iVar18 = bottom_top_blob->elempack;
  iVar16 = bottom_top_blob->dims;
  iVar15 = bottom_top_blob->w;
  uVar4 = bottom_top_blob->h;
  if (iVar16 == 3) {
    iVar16 = iVar15 * iVar18 * uVar4;
    uVar19 = 0;
    uVar4 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar4 = 0;
    }
    pp_Var5 = this->_vptr_PReLU_x86_avx;
    for (; uVar19 != uVar4; uVar19 = uVar19 + 1) {
      pfVar8 = *(float **)(&this->field_0xd8 + (long)pp_Var5[-3]);
      if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) < 2) {
        fVar25 = *pfVar8;
        auVar27._4_4_ = fVar25;
        auVar27._0_4_ = fVar25;
        auVar27._8_4_ = fVar25;
        auVar27._12_4_ = fVar25;
LAB_002e608a:
        auVar30._16_16_ = auVar27;
        auVar30._0_16_ = auVar27;
        auVar28 = auVar30._0_28_;
      }
      else {
        fVar25 = pfVar8[uVar19];
        if (iVar18 == 4) {
          auVar27 = *(undefined1 (*) [16])(pfVar8 + uVar19 * 4);
          goto LAB_002e608a;
        }
        auVar27 = vshufps_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25),0);
        if (iVar18 != 8) goto LAB_002e608a;
        auVar28 = SUB3228(*(undefined1 (*) [32])(pfVar8 + uVar19 * 8),0);
      }
      pvVar7 = bottom_top_blob->data;
      sVar9 = bottom_top_blob->elemsize;
      sVar10 = bottom_top_blob->cstep;
      pauVar23 = (undefined1 (*) [32])(sVar10 * uVar19 * sVar9 + (long)pvVar7);
      lVar17 = 0;
      for (iVar15 = 0; iVar15 + 7 < iVar16; iVar15 = iVar15 + 8) {
        auVar30 = vmaxps_avx(*pauVar23,ZEXT1232(ZEXT812(0)));
        auVar29 = vminps_avx(*pauVar23,ZEXT1232(ZEXT812(0)));
        auVar32._0_4_ = auVar29._0_4_ * auVar28._0_4_ + auVar30._0_4_;
        auVar32._4_4_ = auVar29._4_4_ * auVar28._4_4_ + auVar30._4_4_;
        auVar32._8_4_ = auVar29._8_4_ * auVar28._8_4_ + auVar30._8_4_;
        auVar32._12_4_ = auVar29._12_4_ * auVar28._12_4_ + auVar30._12_4_;
        auVar32._16_4_ = auVar29._16_4_ * auVar28._16_4_ + auVar30._16_4_;
        auVar32._20_4_ = auVar29._20_4_ * auVar28._20_4_ + auVar30._20_4_;
        auVar32._24_4_ = auVar29._24_4_ * auVar28._24_4_ + auVar30._24_4_;
        auVar32._28_4_ = auVar29._28_4_ + auVar30._28_4_;
        *pauVar23 = auVar32;
        pauVar23 = pauVar23 + 1;
        lVar17 = lVar17 + 8;
      }
      for (; iVar15 + 3 < iVar16; iVar15 = iVar15 + 4) {
        auVar26 = vmaxps_avx(*(undefined1 (*) [16])*pauVar23,ZEXT816(0));
        auVar24 = vminps_avx(*(undefined1 (*) [16])*pauVar23,ZEXT816(0));
        *(float *)*pauVar23 = auVar24._0_4_ * auVar27._0_4_ + auVar26._0_4_;
        *(float *)(*pauVar23 + 4) = auVar24._4_4_ * auVar27._4_4_ + auVar26._4_4_;
        *(float *)(*pauVar23 + 8) = auVar24._8_4_ * auVar27._8_4_ + auVar26._8_4_;
        *(float *)(*pauVar23 + 0xc) = auVar24._12_4_ * auVar27._12_4_ + auVar26._12_4_;
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
        lVar17 = lVar17 + 4;
      }
      lVar22 = sVar10 * sVar9 * uVar19;
      for (; (int)lVar17 < iVar16; lVar17 = lVar17 + 1) {
        fVar3 = *(float *)((long)pvVar7 + lVar17 * 4 + lVar22);
        if (fVar3 < 0.0) {
          *(float *)((long)pvVar7 + lVar17 * 4 + lVar22) = fVar3 * fVar25;
        }
      }
    }
  }
  else if (iVar16 == 2) {
    iVar15 = iVar15 * iVar18;
    uVar20 = 0;
    uVar19 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar19 = uVar20;
    }
    pp_Var5 = this->_vptr_PReLU_x86_avx;
    for (; uVar20 != uVar19; uVar20 = uVar20 + 1) {
      pfVar8 = *(float **)(&this->field_0xd8 + (long)pp_Var5[-3]);
      if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) < 2) {
        fVar25 = *pfVar8;
        auVar26._4_4_ = fVar25;
        auVar26._0_4_ = fVar25;
        auVar26._8_4_ = fVar25;
        auVar26._12_4_ = fVar25;
LAB_002e5f49:
        auVar29._16_16_ = auVar26;
        auVar29._0_16_ = auVar26;
        auVar28 = auVar29._0_28_;
      }
      else {
        fVar25 = pfVar8[uVar20];
        if (iVar18 == 4) {
          auVar26 = *(undefined1 (*) [16])(pfVar8 + uVar20 * 4);
          goto LAB_002e5f49;
        }
        auVar26 = vshufps_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25),0);
        if (iVar18 != 8) goto LAB_002e5f49;
        auVar28 = SUB3228(*(undefined1 (*) [32])(pfVar8 + uVar20 * 8),0);
      }
      pvVar7 = bottom_top_blob->data;
      sVar9 = bottom_top_blob->elemsize;
      iVar16 = bottom_top_blob->w;
      pauVar23 = (undefined1 (*) [32])(uVar20 * (long)iVar16 * sVar9 + (long)pvVar7);
      lVar17 = 0;
      for (iVar21 = 0; iVar21 + 7 < iVar15; iVar21 = iVar21 + 8) {
        auVar30 = vmaxps_avx(*pauVar23,ZEXT832(0));
        auVar29 = vminps_avx(*pauVar23,ZEXT832(0));
        auVar31._0_4_ = auVar29._0_4_ * auVar28._0_4_ + auVar30._0_4_;
        auVar31._4_4_ = auVar29._4_4_ * auVar28._4_4_ + auVar30._4_4_;
        auVar31._8_4_ = auVar29._8_4_ * auVar28._8_4_ + auVar30._8_4_;
        auVar31._12_4_ = auVar29._12_4_ * auVar28._12_4_ + auVar30._12_4_;
        auVar31._16_4_ = auVar29._16_4_ * auVar28._16_4_ + auVar30._16_4_;
        auVar31._20_4_ = auVar29._20_4_ * auVar28._20_4_ + auVar30._20_4_;
        auVar31._24_4_ = auVar29._24_4_ * auVar28._24_4_ + auVar30._24_4_;
        auVar31._28_4_ = auVar29._28_4_ + auVar30._28_4_;
        *pauVar23 = auVar31;
        pauVar23 = pauVar23 + 1;
        lVar17 = lVar17 + 8;
      }
      for (; iVar21 + 3 < iVar15; iVar21 = iVar21 + 4) {
        auVar27 = vmaxps_avx(*(undefined1 (*) [16])*pauVar23,ZEXT816(0));
        auVar24 = vminps_avx(*(undefined1 (*) [16])*pauVar23,ZEXT816(0));
        *(float *)*pauVar23 = auVar24._0_4_ * auVar26._0_4_ + auVar27._0_4_;
        *(float *)(*pauVar23 + 4) = auVar24._4_4_ * auVar26._4_4_ + auVar27._4_4_;
        *(float *)(*pauVar23 + 8) = auVar24._8_4_ * auVar26._8_4_ + auVar27._8_4_;
        *(float *)(*pauVar23 + 0xc) = auVar24._12_4_ * auVar26._12_4_ + auVar27._12_4_;
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
        lVar17 = lVar17 + 4;
      }
      lVar22 = sVar9 * uVar20 * (long)iVar16;
      for (; (int)lVar17 < iVar15; lVar17 = lVar17 + 1) {
        fVar3 = *(float *)((long)pvVar7 + lVar17 * 4 + lVar22);
        if (fVar3 < 0.0) {
          *(float *)((long)pvVar7 + lVar17 * 4 + lVar22) = fVar3 * fVar25;
        }
      }
    }
  }
  else if (iVar16 == 1) {
    iVar18 = iVar18 * iVar15;
    pp_Var5 = this->_vptr_PReLU_x86_avx;
    p_Var6 = pp_Var5[-3];
    pvVar7 = bottom_top_blob->data;
    pfVar8 = *(float **)(&this->field_0xd8 + (long)p_Var6);
    if (*(int *)(&this->field_0xd0 + (long)p_Var6) < 2) {
      fVar25 = *pfVar8;
      auVar24._4_4_ = fVar25;
      auVar24._0_4_ = fVar25;
      auVar24._8_4_ = fVar25;
      auVar24._12_4_ = fVar25;
      iVar16 = (int)((long)iVar18 / 8);
      lVar17 = 0;
      uVar19 = 0;
      if (0 < iVar16) {
        uVar19 = (long)iVar18 / 8 & 0xffffffff;
      }
      for (; uVar19 * 0x20 != lVar17; lVar17 = lVar17 + 0x20) {
        auVar30 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar7 + lVar17),ZEXT832(0));
        auVar29 = vminps_avx(*(undefined1 (*) [32])((long)pvVar7 + lVar17),ZEXT832(0));
        pfVar8 = (float *)((long)pvVar7 + lVar17);
        *pfVar8 = auVar29._0_4_ * fVar25 + auVar30._0_4_;
        pfVar8[1] = auVar29._4_4_ * fVar25 + auVar30._4_4_;
        pfVar8[2] = auVar29._8_4_ * fVar25 + auVar30._8_4_;
        pfVar8[3] = auVar29._12_4_ * fVar25 + auVar30._12_4_;
        pfVar8[4] = auVar29._16_4_ * fVar25 + auVar30._16_4_;
        pfVar8[5] = auVar29._20_4_ * fVar25 + auVar30._20_4_;
        pfVar8[6] = auVar29._24_4_ * fVar25 + auVar30._24_4_;
        pfVar8[7] = auVar29._28_4_ + auVar30._28_4_;
      }
      iVar15 = iVar16 * 8;
      uVar19 = (long)(iVar18 + iVar16 * -8) / 4;
      iVar16 = (int)uVar19;
      auVar27 = vshufps_avx(auVar24,auVar24,0);
      lVar17 = 0;
      uVar20 = 0;
      if (0 < iVar16) {
        uVar20 = uVar19 & 0xffffffff;
      }
      while( true ) {
        if (uVar20 * 0x10 == lVar17) break;
        auVar26 = *(undefined1 (*) [16])((long)pvVar7 + lVar17 + (long)iVar15 * 4);
        auVar24 = vmaxps_avx(auVar26,ZEXT816(0) << 0x40);
        auVar26 = vminps_avx(auVar26,ZEXT816(0) << 0x40);
        pfVar8 = (float *)((long)pvVar7 + lVar17 + (long)iVar15 * 4);
        *pfVar8 = auVar26._0_4_ * auVar27._0_4_ + auVar24._0_4_;
        pfVar8[1] = auVar26._4_4_ * auVar27._4_4_ + auVar24._4_4_;
        pfVar8[2] = auVar26._8_4_ * auVar27._8_4_ + auVar24._8_4_;
        pfVar8[3] = auVar26._12_4_ * auVar27._12_4_ + auVar24._12_4_;
        lVar17 = lVar17 + 0x10;
      }
      for (lVar17 = (long)(iVar15 + iVar16 * 4); lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar3 = *(float *)((long)pvVar7 + lVar17 * 4);
        if (fVar3 < 0.0) {
          *(float *)((long)pvVar7 + lVar17 * 4) = fVar3 * fVar25;
        }
      }
    }
    else {
      iVar16 = (int)((long)iVar18 / 8);
      lVar17 = 0;
      uVar19 = 0;
      if (0 < iVar16) {
        uVar19 = (long)iVar18 / 8 & 0xffffffff;
      }
      for (; uVar19 * 0x20 != lVar17; lVar17 = lVar17 + 0x20) {
        auVar29 = vminps_avx(*(undefined1 (*) [32])((long)pvVar7 + lVar17),ZEXT1232(ZEXT812(0)));
        pfVar1 = (float *)((long)pfVar8 + lVar17);
        fVar25 = pfVar1[1];
        fVar3 = pfVar1[2];
        fVar11 = pfVar1[3];
        fVar12 = pfVar1[4];
        fVar13 = pfVar1[5];
        fVar14 = pfVar1[6];
        auVar30 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar7 + lVar17),ZEXT1232(ZEXT812(0)));
        pfVar2 = (float *)((long)pvVar7 + lVar17);
        *pfVar2 = auVar29._0_4_ * *pfVar1 + auVar30._0_4_;
        pfVar2[1] = auVar29._4_4_ * fVar25 + auVar30._4_4_;
        pfVar2[2] = auVar29._8_4_ * fVar3 + auVar30._8_4_;
        pfVar2[3] = auVar29._12_4_ * fVar11 + auVar30._12_4_;
        pfVar2[4] = auVar29._16_4_ * fVar12 + auVar30._16_4_;
        pfVar2[5] = auVar29._20_4_ * fVar13 + auVar30._20_4_;
        pfVar2[6] = auVar29._24_4_ * fVar14 + auVar30._24_4_;
        pfVar2[7] = auVar29._28_4_ + auVar30._28_4_;
      }
      uVar19 = (long)(iVar18 + iVar16 * -8) / 4;
      iVar15 = (int)uVar19;
      lVar22 = (long)(iVar16 * 8);
      lVar17 = 0;
      uVar20 = 0;
      if (0 < iVar15) {
        uVar20 = uVar19 & 0xffffffff;
      }
      for (; uVar20 * 0x10 != lVar17; lVar17 = lVar17 + 0x10) {
        auVar27 = *(undefined1 (*) [16])((long)pvVar7 + lVar17 + lVar22 * 4);
        auVar26 = vminps_avx(auVar27,ZEXT416(0) << 0x20);
        pfVar1 = (float *)((long)pfVar8 + lVar17 + lVar22 * 4);
        fVar25 = pfVar1[1];
        fVar3 = pfVar1[2];
        fVar11 = pfVar1[3];
        auVar27 = vmaxps_avx(auVar27,ZEXT416(0) << 0x20);
        pfVar2 = (float *)((long)pvVar7 + lVar17 + lVar22 * 4);
        *pfVar2 = auVar26._0_4_ * *pfVar1 + auVar27._0_4_;
        pfVar2[1] = auVar26._4_4_ * fVar25 + auVar27._4_4_;
        pfVar2[2] = auVar26._8_4_ * fVar3 + auVar27._8_4_;
        pfVar2[3] = auVar26._12_4_ * fVar11 + auVar27._12_4_;
      }
      for (lVar17 = (long)(iVar16 * 8 + iVar15 * 4); lVar17 < iVar18; lVar17 = lVar17 + 1) {
        fVar25 = *(float *)((long)pvVar7 + lVar17 * 4);
        if (fVar25 < 0.0) {
          *(float *)((long)pvVar7 + lVar17 * 4) =
               fVar25 * *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var5[-3]) + lVar17 * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}